

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cc
# Opt level: O2

string * __thiscall
phosg::format_duration_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,uint64_t usecs,int8_t subsecond_precision)

{
  undefined1 auVar1 [16];
  phosg *ppVar2;
  reference pvVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  char cVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  string seconds_str;
  string local_48;
  
  cVar7 = (char)usecs;
  if ((this < (phosg *)0xf4240) || (this < (phosg *)0x3938700)) {
    uVar8 = 6;
    if (-1 < cVar7) {
      uVar8 = usecs & 0xff;
    }
    string_printf_abi_cxx11_(__return_storage_ptr__,"%.*lf",(double)(long)this / 1000000.0,uVar8);
  }
  else {
    if ((ulong)this >> 10 < 0x35a4e9) {
      uVar8 = 3;
      if (-1 < cVar7) {
        uVar8 = usecs & 0xff;
      }
      uVar9 = ((ulong)this & 0xffffffff) / 60000000;
      ppVar2 = this + uVar9 * -60000000;
      auVar10._8_4_ = (int)((ulong)ppVar2 >> 0x20);
      auVar10._0_8_ = ppVar2;
      auVar10._12_4_ = 0x45300000;
      string_printf_abi_cxx11_
                (&seconds_str,"%.*lf",
                 ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)ppVar2) - 4503599627370496.0)) / 1000000.0,uVar8)
      ;
      pvVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (&seconds_str,1);
      pcVar6 = "";
      if (*pvVar3 == '.') {
        pcVar6 = "0";
      }
      string_printf_abi_cxx11_(&local_48,"%lu:%s",uVar9,pcVar6);
      ::std::operator+(__return_storage_ptr__,&local_48,&seconds_str);
    }
    else {
      uVar5 = 0;
      if ('\0' < cVar7) {
        uVar5 = (uint)usecs & 0xff;
      }
      if ((ulong)this >> 0xd < 0xa0eebb) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = this;
        uVar8 = (ulong)(ushort)(SUB162(auVar1 / ZEXT816(60000000),0) % 0x3c);
        lVar4 = uVar8 * -60000000 + (ulong)this % 3600000000;
        auVar11._8_4_ = (int)((ulong)lVar4 >> 0x20);
        auVar11._0_8_ = lVar4;
        auVar11._12_4_ = 0x45300000;
        string_printf_abi_cxx11_
                  (&seconds_str,"%.*lf",
                   ((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / 1000000.0,uVar5
                  );
        if (seconds_str._M_string_length == 1) {
          pcVar6 = "0";
        }
        else {
          pvVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::at(&seconds_str,1);
          pcVar6 = "";
          if (*pvVar3 == '.') {
            pcVar6 = "0";
          }
        }
        string_printf_abi_cxx11_(&local_48,"%lu:%02lu:%s",(ulong)this / 3600000000,uVar8,pcVar6);
        ::std::operator+(__return_storage_ptr__,&local_48,&seconds_str);
      }
      else {
        uVar8 = ((ulong)this / 3600000000) % 0x18;
        uVar9 = ((ulong)this / 60000000) % 0x3c;
        lVar4 = uVar9 * -60000000 + uVar8 * -3600000000 + (ulong)this % 86400000000;
        auVar12._8_4_ = (int)((ulong)lVar4 >> 0x20);
        auVar12._0_8_ = lVar4;
        auVar12._12_4_ = 0x45300000;
        string_printf_abi_cxx11_
                  (&seconds_str,"%.*lf",
                   ((auVar12._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / 1000000.0,uVar5
                  );
        if (seconds_str._M_string_length == 1) {
          pcVar6 = "0";
        }
        else {
          pvVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::at(&seconds_str,1);
          pcVar6 = "";
          if (*pvVar3 == '.') {
            pcVar6 = "0";
          }
        }
        string_printf_abi_cxx11_
                  (&local_48,"%lu:%02lu:%02lu:%s",(ulong)this / 86400000000,uVar8,uVar9,pcVar6);
        ::std::operator+(__return_storage_ptr__,&local_48,&seconds_str);
      }
    }
    ::std::__cxx11::string::~string((string *)&local_48);
    ::std::__cxx11::string::~string((string *)&seconds_str);
  }
  return __return_storage_ptr__;
}

Assistant:

string format_duration(uint64_t usecs, int8_t subsecond_precision) {
  if (usecs < 1000000ULL) {
    if (subsecond_precision < 0) {
      subsecond_precision = 6;
    }
    return string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs) / 1000000ULL);

  } else if (usecs < 60 * 1000000ULL) {
    if (subsecond_precision < 0) {
      subsecond_precision = 6;
    }
    return string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs) / 1000000ULL);

  } else if (usecs < 60 * 60 * 1000000ULL) {
    if (subsecond_precision < 0) {
      subsecond_precision = 3;
    }
    uint64_t minutes = usecs / (60 * 1000000ULL);
    uint64_t usecs_part = usecs - (minutes * 60 * 1000000ULL);
    string seconds_str = string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs_part) / 1000000ULL);
    return string_printf("%" PRIu64 ":%s", minutes,
               ((seconds_str.at(1) == '.') ? "0" : "")) +
        seconds_str;

  } else if (usecs < 24 * 60 * 60 * 1000000ULL) {
    if (subsecond_precision < 0) {
      subsecond_precision = 0;
    }
    uint64_t hours = usecs / (60 * 60 * 1000000ULL);
    uint64_t minutes = (usecs / (60 * 1000000ULL)) % 60;
    uint64_t usecs_part = usecs - (hours * 60 * 60 * 1000000ULL) - (minutes * 60 * 1000000ULL);
    string seconds_str = string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs_part) / 1000000ULL);
    return string_printf("%" PRIu64 ":%02" PRIu64 ":%s", hours, minutes,
               ((seconds_str.size() == 1 || seconds_str.at(1) == '.') ? "0" : "")) +
        seconds_str;

  } else {
    if (subsecond_precision < 0) {
      subsecond_precision = 0;
    }
    uint64_t days = usecs / (24 * 60 * 60 * 1000000ULL);
    uint64_t hours = (usecs / (60 * 60 * 1000000ULL)) % 24;
    uint64_t minutes = (usecs / (60 * 1000000ULL)) % 60;
    uint64_t usecs_part = usecs - (days * 24 * 60 * 60 * 1000000ULL) - (hours * 60 * 60 * 1000000ULL) - (minutes * 60 * 1000000ULL);
    string seconds_str = string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs_part) / 1000000ULL);
    return string_printf("%" PRIu64 ":%02" PRIu64 ":%02" PRIu64 ":%s", days,
               hours, minutes, ((seconds_str.size() == 1 || seconds_str.at(1) == '.') ? "0" : "")) +
        seconds_str;
  }
}